

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O2

void DeserializeHDKeypaths<DataStream>
               (DataStream *s,vector<unsigned_char,_std::allocator<unsigned_char>_> *key,
               map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
               *hd_keypaths)

{
  KeyOriginInfo *pKVar1;
  pointer puVar2;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  pend;
  bool bVar3;
  long lVar4;
  size_type sVar5;
  char *pcVar6;
  KeyOriginInfo *__args_1;
  long in_FS_OFFSET;
  KeyOriginInfo keypath;
  CPubKey pubkey;
  
  pKVar1 = *(KeyOriginInfo **)(in_FS_OFFSET + 0x28);
  puVar2 = (key->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pend._M_current =
       (key->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  lVar4 = (long)pend._M_current - (long)puVar2;
  if ((lVar4 == 0x22) || (lVar4 == 0x42)) {
    __args_1 = pKVar1;
    CPubKey::
    Set<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (&pubkey,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )(puVar2 + 1),pend);
    bVar3 = CPubKey::IsFullyValid(&pubkey);
    if (bVar3) {
      sVar5 = std::
              map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
              ::count(hd_keypaths,&pubkey);
      if (sVar5 == 0) {
        keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        DeserializeHDKeypath<DataStream>(s,&keypath);
        std::
        _Rb_tree<CPubKey,std::pair<CPubKey_const,KeyOriginInfo>,std::_Select1st<std::pair<CPubKey_const,KeyOriginInfo>>,std::less<CPubKey>,std::allocator<std::pair<CPubKey_const,KeyOriginInfo>>>
        ::_M_emplace_unique<CPubKey&,KeyOriginInfo>
                  ((pair<std::_Rb_tree_iterator<std::pair<const_CPubKey,_KeyOriginInfo>_>,_bool> *)
                   hd_keypaths,
                   (_Rb_tree<CPubKey,std::pair<CPubKey_const,KeyOriginInfo>,std::_Select1st<std::pair<CPubKey_const,KeyOriginInfo>>,std::less<CPubKey>,std::allocator<std::pair<CPubKey_const,KeyOriginInfo>>>
                    *)&pubkey,(CPubKey *)&keypath,__args_1);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        if (*(KeyOriginInfo **)(in_FS_OFFSET + 0x28) == pKVar1) {
          return;
        }
      }
      else {
        pcVar6 = (char *)__cxa_allocate_exception(0x20);
        keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        keypath.fingerprint[0] = '\x01';
        keypath.fingerprint[1] = '\0';
        keypath.fingerprint[2] = '\0';
        keypath.fingerprint[3] = '\0';
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar6,(error_code *)"Duplicate Key, pubkey derivation path already provided");
        if (*(KeyOriginInfo **)(in_FS_OFFSET + 0x28) == pKVar1) {
          __cxa_throw(pcVar6,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
    }
    else {
      pcVar6 = (char *)__cxa_allocate_exception(0x20);
      keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)std::iostream_category();
      keypath.fingerprint[0] = '\x01';
      keypath.fingerprint[1] = '\0';
      keypath.fingerprint[2] = '\0';
      keypath.fingerprint[3] = '\0';
      std::ios_base::failure[abi:cxx11]::failure(pcVar6,(error_code *)"Invalid pubkey");
      if (*(KeyOriginInfo **)(in_FS_OFFSET + 0x28) == pKVar1) {
        __cxa_throw(pcVar6,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
    }
  }
  else {
    pcVar6 = (char *)__cxa_allocate_exception(0x20);
    pubkey.vch._8_8_ = std::iostream_category();
    pubkey.vch[0] = '\x01';
    pubkey.vch[1] = '\0';
    pubkey.vch[2] = '\0';
    pubkey.vch[3] = '\0';
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar6,(error_code *)
                      "Size of key was not the expected size for the type BIP32 keypath");
    if (*(KeyOriginInfo **)(in_FS_OFFSET + 0x28) == pKVar1) {
      __cxa_throw(pcVar6,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  __stack_chk_fail();
}

Assistant:

void DeserializeHDKeypaths(Stream& s, const std::vector<unsigned char>& key, std::map<CPubKey, KeyOriginInfo>& hd_keypaths)
{
    // Make sure that the key is the size of pubkey + 1
    if (key.size() != CPubKey::SIZE + 1 && key.size() != CPubKey::COMPRESSED_SIZE + 1) {
        throw std::ios_base::failure("Size of key was not the expected size for the type BIP32 keypath");
    }
    // Read in the pubkey from key
    CPubKey pubkey(key.begin() + 1, key.end());
    if (!pubkey.IsFullyValid()) {
       throw std::ios_base::failure("Invalid pubkey");
    }
    if (hd_keypaths.count(pubkey) > 0) {
        throw std::ios_base::failure("Duplicate Key, pubkey derivation path already provided");
    }

    KeyOriginInfo keypath;
    DeserializeHDKeypath(s, keypath);

    // Add to map
    hd_keypaths.emplace(pubkey, std::move(keypath));
}